

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void InitParVars(ON_RTreePartitionVars *a_parVars,int a_maxRects,int a_minFill)

{
  int local_1c;
  int index;
  int a_minFill_local;
  int a_maxRects_local;
  ON_RTreePartitionVars *a_parVars_local;
  
  a_parVars->m_count[1] = 0;
  a_parVars->m_count[0] = 0;
  a_parVars->m_area[1] = 0.0;
  a_parVars->m_area[0] = 0.0;
  a_parVars->m_total = a_maxRects;
  a_parVars->m_minFill = a_minFill;
  for (local_1c = 0; local_1c < a_maxRects; local_1c = local_1c + 1) {
    a_parVars->m_taken[local_1c] = 0;
    a_parVars->m_partition[local_1c] = -1;
  }
  return;
}

Assistant:

static void InitParVars(ON_RTreePartitionVars* a_parVars, int a_maxRects, int a_minFill)
{
  a_parVars->m_count[0] = a_parVars->m_count[1] = 0;
  a_parVars->m_area[0] = a_parVars->m_area[1] = (double)0;
  a_parVars->m_total = a_maxRects;
  a_parVars->m_minFill = a_minFill;
  for(int index=0; index < a_maxRects; ++index)
  {
    a_parVars->m_taken[index] = false;
    a_parVars->m_partition[index] = -1;
  }
}